

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::js::(anonymous_namespace)::GetMessageFileName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,GeneratorOptions *options,
          Descriptor *desc)

{
  string *input;
  string local_b0;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  GeneratorOptions *local_20;
  Descriptor *desc_local;
  GeneratorOptions *options_local;
  
  local_20 = options;
  desc_local = (Descriptor *)this;
  options_local = (GeneratorOptions *)__return_storage_ptr__;
  std::operator+(&local_60,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this
                 ,"/");
  input = Descriptor::name_abi_cxx11_((Descriptor *)local_20);
  anon_unknown_0::ToFileName(&local_80,input);
  std::operator+(&local_40,&local_60,&local_80);
  GeneratorOptions::GetFileNameExtension_abi_cxx11_(&local_b0,(GeneratorOptions *)desc_local);
  std::operator+(__return_storage_ptr__,&local_40,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_60);
  return __return_storage_ptr__;
}

Assistant:

string GetMessageFileName(const GeneratorOptions& options,
                          const Descriptor* desc) {
  return options.output_dir + "/" + ToFileName(desc->name()) +
         options.GetFileNameExtension();
}